

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

void __thiscall VcprojGenerator::initConfiguration(VcprojGenerator *this)

{
  QMakeProject *pQVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  QArrayData *pQVar5;
  SourceFiles *pSVar6;
  int *piVar7;
  QString file;
  long lVar8;
  undefined8 uVar9;
  bool bVar10;
  char cVar11;
  bool bVar12;
  short sVar13;
  DotNET DVar14;
  ConfigurationTypes CVar15;
  triState tVar16;
  charSet cVar17;
  ProStringList *this_00;
  long lVar18;
  char *pcVar19;
  long in_FS_OFFSET;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QAnyStringView QVar23;
  QByteArrayView QVar24;
  QAnyStringView QVar25;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  QFileInfo targetInfo;
  ProString temp;
  char in_stack_fffffffffffffed8;
  char cVar26;
  undefined7 in_stack_fffffffffffffed9;
  undefined7 uVar27;
  undefined7 uVar28;
  QString *in_stack_fffffffffffffee0;
  QString *pQVar29;
  QString *pQVar30;
  qsizetype in_stack_fffffffffffffee8;
  qsizetype qVar31;
  qsizetype qVar32;
  undefined1 local_f8 [64];
  QString local_b8;
  undefined1 local_a0 [8];
  ProString local_98;
  undefined1 local_68 [28];
  int iStack_4c;
  undefined1 *local_48;
  Data *pDStack_40;
  char16_t *local_38;
  
  local_38 = *(char16_t **)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  QVar20.m_data = (storage_type *)0x18;
  QVar20.m_size = (qsizetype)local_f8;
  QString::fromUtf8(QVar20);
  uVar9 = local_f8._0_8_;
  config.m_data = (storage_type_conflict *)local_f8._8_8_;
  config.m_size = local_f8._16_8_;
  bVar10 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
  (this->vcProject).Configuration.suppressUnknownOptionWarnings = bVar10;
  if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
    }
  }
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_68,"MSVC_VER");
  QMakeEvaluator::first((ProString *)local_f8,&pQVar1->super_QMakeEvaluator,(ProKey *)local_68);
  DVar14 = vsVersionFromString((ProString *)local_f8);
  (this->vcProject).Configuration.CompilerVersion = DVar14;
  if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  initCompilerTool(this);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  QVar21.m_data = (storage_type *)0x5;
  QVar21.m_size = (qsizetype)local_f8;
  QString::fromUtf8(QVar21);
  uVar9 = local_f8._0_8_;
  config_00.m_data = (storage_type_conflict *)local_f8._8_8_;
  config_00.m_size = local_f8._16_8_;
  bVar10 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_00,false);
  if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
    }
  }
  if (this->projectTarget == StaticLib) {
    initLibrarianTool(this);
  }
  else {
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QVar22.m_data = (storage_type *)0xa;
    QVar22.m_size = (qsizetype)local_f8;
    QString::fromUtf8(QVar22);
    uVar9 = local_f8._0_8_;
    config_01.m_data = (storage_type_conflict *)local_f8._8_8_;
    config_01.m_size = local_f8._16_8_;
    bVar12 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_01,false);
    (this->vcProject).Configuration.linker.GenerateDebugInformation = (uint)bVar12;
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
      }
    }
    initLinkerTool(this);
  }
  initManifestTool(this);
  initResourceTool(this);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pDStack_40 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_f8,"BuildBrowserInformation");
  QMakeEvaluator::first((ProString *)local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)local_f8);
  if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
    }
  }
  CVar15 = typeDynamicLibrary;
  if (this->projectTarget != SharedLib) {
    CVar15 = (uint)(this->projectTarget == StaticLib) * 3 + typeApplication;
  }
  (this->vcProject).Configuration.ConfigurationType = CVar15;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)(local_a0 + 8),"DESTDIR");
  QMakeEvaluator::first
            ((ProString *)local_f8,&pQVar1->super_QMakeEvaluator,(ProKey *)(local_a0 + 8));
  ProString::toQString((QString *)&stack0xfffffffffffffed8,(ProString *)local_f8);
  pQVar2 = &((this->vcProject).Configuration.OutputDirectory.d.d)->super_QArrayData;
  pQVar29 = (QString *)(this->vcProject).Configuration.OutputDirectory.d.ptr;
  cVar26 = (char)pQVar2;
  uVar27 = (undefined7)((ulong)pQVar2 >> 8);
  (this->vcProject).Configuration.OutputDirectory.d.d =
       (Data *)CONCAT71(in_stack_fffffffffffffed9,in_stack_fffffffffffffed8);
  (this->vcProject).Configuration.OutputDirectory.d.ptr = (char16_t *)in_stack_fffffffffffffee0;
  qVar31 = (this->vcProject).Configuration.OutputDirectory.d.size;
  (this->vcProject).Configuration.OutputDirectory.d.size = in_stack_fffffffffffffee8;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
    }
  }
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar30 = &(this->vcProject).Configuration.OutputDirectory;
  if ((this->vcProject).Configuration.OutputDirectory.d.size == 0) {
    QVar23.m_size = (size_t)".\\";
    QVar23.field_0.m_data_utf8 = (char *)pQVar30;
    QString::assign(QVar23);
  }
  QVar24.m_data = (storage_type *)0x1;
  QVar24.m_size = (qsizetype)local_f8;
  QString::fromUtf8(QVar24);
  local_98.m_string.d.d = (Data *)local_f8._0_8_;
  local_98.m_string.d.ptr = (char16_t *)local_f8._8_8_;
  local_98.m_string.d.size = local_f8._16_8_;
  cVar11 = QString::endsWith((QString *)pQVar30,(int)local_a0 + 8);
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (cVar11 == '\0') {
    QString::append((QChar)(char16_t)pQVar30);
  }
  if (0x9f < (int)(this->vcProject).Configuration.CompilerVersion) {
    retrievePlatformToolSet((QString *)local_f8,this);
    pQVar2 = &((this->vcProject).Configuration.PlatformToolSet.d.d)->super_QArrayData;
    pDVar3 = (Data *)(this->vcProject).Configuration.PlatformToolSet.d.ptr;
    (this->vcProject).Configuration.PlatformToolSet.d.d = (Data *)local_f8._0_8_;
    (this->vcProject).Configuration.PlatformToolSet.d.ptr = (char16_t *)local_f8._8_8_;
    pcVar4 = (char16_t *)(this->vcProject).Configuration.PlatformToolSet.d.size;
    (this->vcProject).Configuration.PlatformToolSet.d.size = local_f8._16_8_;
    local_f8._0_8_ = pQVar2;
    local_f8._8_8_ = pDVar3;
    local_f8._16_8_ = pcVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    local_a0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)(local_a0 + 8),"MSVCPROJ_TARGET");
    QMakeEvaluator::first
              ((ProString *)local_f8,&pQVar1->super_QMakeEvaluator,(ProKey *)(local_a0 + 8));
    ProString::toQString(&local_b8,(ProString *)local_f8);
    file.d.d._1_7_ = uVar27;
    file.d.d._0_1_ = cVar26;
    file.d.ptr = (char16_t *)pQVar29;
    file.d.size = qVar31;
    MakefileGenerator::fileInfo((MakefileGenerator *)local_a0,file);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
      }
    }
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QFileInfo::completeBaseName();
    pQVar2 = &((this->vcProject).Configuration.PrimaryOutput.d.d)->super_QArrayData;
    pDVar3 = (Data *)(this->vcProject).Configuration.PrimaryOutput.d.ptr;
    (this->vcProject).Configuration.PrimaryOutput.d.d = (Data *)local_f8._0_8_;
    (this->vcProject).Configuration.PrimaryOutput.d.ptr = (char16_t *)local_f8._8_8_;
    pcVar4 = (char16_t *)(this->vcProject).Configuration.PrimaryOutput.d.size;
    (this->vcProject).Configuration.PrimaryOutput.d.size = local_f8._16_8_;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        local_f8._0_8_ = pQVar2;
        local_f8._8_8_ = pDVar3;
        local_f8._16_8_ = pcVar4;
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    pQVar30 = (QString *)local_f8;
    local_f8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::suffix();
    bVar12 = isStandardSuffix(this,pQVar30);
    if (!bVar12) {
      cVar26 = '.';
      QStringBuilder<char,_const_QString_&>::convertTo<QString>
                ((QString *)(local_a0 + 8),
                 (QStringBuilder<char,_const_QString_&> *)&stack0xfffffffffffffed8);
      pQVar2 = &((this->vcProject).Configuration.PrimaryOutputExtension.d.d)->super_QArrayData;
      pQVar5 = (QArrayData *)(this->vcProject).Configuration.PrimaryOutputExtension.d.ptr;
      (this->vcProject).Configuration.PrimaryOutputExtension.d.d = local_98.m_string.d.d;
      (this->vcProject).Configuration.PrimaryOutputExtension.d.ptr = local_98.m_string.d.ptr;
      pcVar4 = (char16_t *)(this->vcProject).Configuration.PrimaryOutputExtension.d.size;
      (this->vcProject).Configuration.PrimaryOutputExtension.d.size = local_98.m_string.d.size;
      pQVar29 = pQVar30;
      local_98.m_string.d.d = (Data *)pQVar2;
      local_98.m_string.d.ptr = (char16_t *)pQVar5;
      local_98.m_string.d.size = (qsizetype)pcVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
          pQVar29 = pQVar30;
        }
      }
    }
    if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
      }
    }
    QFileInfo::~QFileInfo((QFileInfo *)local_a0);
  }
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_f8,"BUILD_NAME");
  this_00 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_f8);
  ProStringList::join((QString *)(local_a0 + 8),this_00,(QChar)0x20);
  pQVar2 = &((this->vcProject).Configuration.Name.d.d)->super_QArrayData;
  pSVar6 = (SourceFiles *)(this->vcProject).Configuration.Name.d.ptr;
  (this->vcProject).Configuration.Name.d.d = local_98.m_string.d.d;
  (this->vcProject).Configuration.Name.d.ptr = local_98.m_string.d.ptr;
  qVar32 = (this->vcProject).Configuration.Name.d.size;
  (this->vcProject).Configuration.Name.d.size = local_98.m_string.d.size;
  local_98.m_string.d.d = (Data *)pQVar2;
  local_98.m_string.d.ptr = (char16_t *)pSVar6;
  local_98.m_string.d.size = qVar32;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
    }
  }
  pQVar30 = &(this->vcProject).Configuration.Name;
  if ((this->vcProject).Configuration.Name.d.size == 0) {
    pcVar19 = "Release";
    if (bVar10) {
      pcVar19 = "Debug";
    }
    QVar25.m_size = (size_t)pcVar19;
    QVar25.field_0.m_data_utf8 = (char *)pQVar30;
    QString::assign(QVar25);
  }
  QString::operator=(&(this->vcProject).Configuration.ConfigurationName,(QString *)pQVar30);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_f8,"VCPROJ_ARCH");
  bVar10 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_f8);
  if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
    }
  }
  if (bVar10) {
    pcVar19 = "|Win32";
    if (this->is64Bit != false) {
      pcVar19 = "|x64";
    }
    lVar18 = -1;
    do {
      lVar8 = lVar18 + 1;
      lVar18 = lVar18 + 1;
    } while (pcVar19[lVar8] != '\0');
    QString::append(pQVar30);
  }
  else {
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&stack0xfffffffffffffed8,"VCPROJ_ARCH");
    QMakeEvaluator::first
              ((ProString *)(local_a0 + 8),&pQVar1->super_QMakeEvaluator,
               (ProKey *)&stack0xfffffffffffffed8);
    local_f8._0_8_ = "|";
    ProString::ProString((ProString *)(local_f8 + 8),(ProString *)(local_a0 + 8));
    ::operator+=(pQVar30,(QStringBuilder<const_char_(&)[2],_ProString> *)local_f8);
    if ((QArrayData *)local_f8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_f8._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_f8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_f8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8._8_8_,2,0x10);
      }
    }
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar7 = (int *)CONCAT71(uVar27,cVar26);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(uVar27,cVar26),2,0x10);
      }
    }
  }
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)(local_a0 + 8),"ATLMinimizesCRunTimeLibraryUsage");
  QMakeEvaluator::first
            ((ProString *)local_f8,&pQVar1->super_QMakeEvaluator,(ProKey *)(local_a0 + 8));
  (this->vcProject).Configuration.ATLMinimizesCRunTimeLibraryUsage = (uint)(local_f8._28_4_ != 0);
  if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
    }
  }
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (iStack_4c == 0) {
    tVar16 = unset;
  }
  else {
    sVar13 = ProString::toShort((ProString *)local_68,(bool *)0x0,10);
    tVar16 = (triState)sVar13;
  }
  (this->vcProject).Configuration.BuildBrowserInformation = tVar16;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)(local_a0 + 8),"CharacterSet");
  QMakeEvaluator::first
            ((ProString *)local_f8,&pQVar1->super_QMakeEvaluator,(ProKey *)(local_a0 + 8));
  QString::operator=((QString *)local_68,(QString *)local_f8);
  iStack_4c = local_f8._28_4_;
  local_48 = (undefined1 *)local_f8._32_8_;
  pDStack_40 = (Data *)local_f8._40_8_;
  if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
    }
  }
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (iStack_4c == 0) {
    cVar17 = charSetNotSet;
  }
  else {
    sVar13 = ProString::toShort((ProString *)local_68,(bool *)0x0,10);
    cVar17 = (charSet)sVar13;
  }
  (this->vcProject).Configuration.CharacterSet = cVar17;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)(local_a0 + 8),"DeleteExtensionsOnClean");
  QMakeEvaluator::first
            ((ProString *)local_f8,&pQVar1->super_QMakeEvaluator,(ProKey *)(local_a0 + 8));
  ProString::toQString((QString *)&stack0xfffffffffffffed8,(ProString *)local_f8);
  pQVar2 = &((this->vcProject).Configuration.DeleteExtensionsOnClean.d.d)->super_QArrayData;
  pQVar30 = (QString *)(this->vcProject).Configuration.DeleteExtensionsOnClean.d.ptr;
  cVar11 = (char)pQVar2;
  uVar28 = (undefined7)((ulong)pQVar2 >> 8);
  (this->vcProject).Configuration.DeleteExtensionsOnClean.d.d = (Data *)CONCAT71(uVar27,cVar26);
  (this->vcProject).Configuration.DeleteExtensionsOnClean.d.ptr = (char16_t *)pQVar29;
  qVar32 = (this->vcProject).Configuration.DeleteExtensionsOnClean.d.size;
  (this->vcProject).Configuration.DeleteExtensionsOnClean.d.size = qVar31;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
    }
  }
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  QString::operator=(&(this->vcProject).Configuration.ImportLibrary,
                     (QString *)&(this->vcProject).Configuration.linker.ImportLibrary);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)(local_a0 + 8),"OBJECTS_DIR");
  QMakeEvaluator::first
            ((ProString *)local_f8,&pQVar1->super_QMakeEvaluator,(ProKey *)(local_a0 + 8));
  ProString::toQString((QString *)&stack0xfffffffffffffed8,(ProString *)local_f8);
  pQVar2 = &((this->vcProject).Configuration.IntermediateDirectory.d.d)->super_QArrayData;
  (this->vcProject).Configuration.IntermediateDirectory.d.d = (Data *)CONCAT71(uVar28,cVar11);
  (this->vcProject).Configuration.IntermediateDirectory.d.ptr = (char16_t *)pQVar30;
  (this->vcProject).Configuration.IntermediateDirectory.d.size = qVar32;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
    }
  }
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  (this->vcProject).Configuration.WholeProgramOptimization =
       (this->vcProject).Configuration.compiler.WholeProgramOptimization;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)(local_a0 + 8),"UseOfATL");
  QMakeEvaluator::first
            ((ProString *)local_f8,&pQVar1->super_QMakeEvaluator,(ProKey *)(local_a0 + 8));
  QString::operator=((QString *)local_68,(QString *)local_f8);
  pDStack_40 = (Data *)local_f8._40_8_;
  iStack_4c = local_f8._28_4_;
  local_48 = (undefined1 *)local_f8._32_8_;
  if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
    }
  }
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (iStack_4c != 0) {
    sVar13 = ProString::toShort((ProString *)local_68,(bool *)0x0,10);
    (this->vcProject).Configuration.UseOfATL = (int)sVar13;
  }
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)(local_a0 + 8),"UseOfMfc");
  QMakeEvaluator::first
            ((ProString *)local_f8,&pQVar1->super_QMakeEvaluator,(ProKey *)(local_a0 + 8));
  QString::operator=((QString *)local_68,(QString *)local_f8);
  pDStack_40 = (Data *)local_f8._40_8_;
  iStack_4c = local_f8._28_4_;
  local_48 = (undefined1 *)local_f8._32_8_;
  if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
    }
  }
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (iStack_4c != 0) {
    sVar13 = ProString::toShort((ProString *)local_68,(bool *)0x0,10);
    (this->vcProject).Configuration.UseOfMfc = (int)sVar13;
  }
  initPostBuildEventTools(this);
  if ((((this->super_Win32MakefileGenerator).super_MakefileGenerator.project)->super_QMakeEvaluator)
      .m_hostBuild == false) {
    initDeploymentTool(this);
  }
  initWinDeployQtTool(this);
  initPreLinkEventTools(this);
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  if (*(char16_t **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initConfiguration()
{
    // Initialize XML sub elements
    // - Do this first since main configuration elements may need
    // - to know of certain compiler/linker options
    VCConfiguration &conf = vcProject.Configuration;
    conf.suppressUnknownOptionWarnings = project->isActiveConfig("suppress_vcproj_warnings");
    conf.CompilerVersion = vsVersionFromString(project->first("MSVC_VER"));

    initCompilerTool();

    // Only on configuration per build
    bool isDebug = project->isActiveConfig("debug");

    if(projectTarget == StaticLib)
        initLibrarianTool();
    else {
        conf.linker.GenerateDebugInformation = project->isActiveConfig("debug_info") ? _True : _False;
        initLinkerTool();
    }
    initManifestTool();
    initResourceTool();
    initIDLTool();

    // Own elements -----------------------------
    ProString temp = project->first("BuildBrowserInformation");
    switch (projectTarget) {
    case SharedLib:
        conf.ConfigurationType = typeDynamicLibrary;
        break;
    case StaticLib:
        conf.ConfigurationType = typeStaticLibrary;
        break;
    case Application:
    default:
        conf.ConfigurationType = typeApplication;
        break;
    }

    conf.OutputDirectory = project->first("DESTDIR").toQString();
    if (conf.OutputDirectory.isEmpty())
        conf.OutputDirectory = ".\\";
    if (!conf.OutputDirectory.endsWith("\\"))
        conf.OutputDirectory += '\\';
    if (conf.CompilerVersion >= NET2010) {
        conf.PlatformToolSet = retrievePlatformToolSet();

        const QFileInfo targetInfo = fileInfo(project->first("MSVCPROJ_TARGET").toQString());
        conf.PrimaryOutput = targetInfo.completeBaseName();

        const QString targetSuffix = targetInfo.suffix();
        if (!isStandardSuffix(targetSuffix))
            conf.PrimaryOutputExtension = '.' + targetSuffix;
    }

    conf.Name = project->values("BUILD_NAME").join(' ');
    if (conf.Name.isEmpty())
        conf.Name = isDebug ? "Debug" : "Release";
    conf.ConfigurationName = conf.Name;
    if (!project->isEmpty("VCPROJ_ARCH")) {
        conf.Name += "|" + project->first("VCPROJ_ARCH");
    } else {
        conf.Name += (is64Bit ? "|x64" : "|Win32");
    }
    conf.ATLMinimizesCRunTimeLibraryUsage = (project->first("ATLMinimizesCRunTimeLibraryUsage").isEmpty() ? _False : _True);
    conf.BuildBrowserInformation = triState(temp.isEmpty() ? (short)unset : temp.toShort());
    temp = project->first("CharacterSet");
    conf.CharacterSet = charSet(temp.isEmpty() ? short(charSetNotSet) : temp.toShort());
    conf.DeleteExtensionsOnClean = project->first("DeleteExtensionsOnClean").toQString();
    conf.ImportLibrary = conf.linker.ImportLibrary;
    conf.IntermediateDirectory = project->first("OBJECTS_DIR").toQString();
    conf.WholeProgramOptimization = conf.compiler.WholeProgramOptimization;
    temp = project->first("UseOfATL");
    if(!temp.isEmpty())
        conf.UseOfATL = useOfATL(temp.toShort());
    temp = project->first("UseOfMfc");
    if(!temp.isEmpty())
        conf.UseOfMfc = useOfMfc(temp.toShort());

    // Configuration does not need parameters from
    // these sub XML items;
    initCustomBuildTool();
    initPreBuildEventTools();
    initPostBuildEventTools();
    // Only deploy for crosscompiled projects
    if (!project->isHostBuild())
        initDeploymentTool();
    initWinDeployQtTool();
    initPreLinkEventTools();
}